

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O0

bool __thiscall rw::Animation::streamWriteLegacy(Animation *this,Stream *stream)

{
  double *pdVar1;
  void *pvVar2;
  double dVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  double in_XMM1_Qa;
  int local_24;
  int32 i;
  HAnimKeyFrame *frames;
  Stream *stream_local;
  Animation *this_local;
  
  Stream::writeI32(stream,this->numFrames);
  Stream::writeI32(stream,this->flags);
  Stream::writeF32(stream,this->duration);
  pvVar2 = this->keyframes;
  uVar4 = extraout_XMM0_Da;
  uVar5 = extraout_XMM0_Db;
  for (local_24 = 0; local_24 < this->numFrames; local_24 = local_24 + 1) {
    dVar3 = conj((double)CONCAT44(uVar5,uVar4));
    pdVar1 = (double *)((long)pvVar2 + (long)local_24 * 0x28 + 0xc);
    *pdVar1 = dVar3;
    pdVar1[1] = in_XMM1_Qa;
    Stream::write32(stream,(void *)((long)pvVar2 + (long)local_24 * 0x28 + 0xc),0x10);
    dVar3 = conj((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    *(double *)((long)pvVar2 + (long)local_24 * 0x28 + 0xc) = dVar3;
    *(double *)((long)pvVar2 + (long)local_24 * 0x28 + 0x14) = in_XMM1_Qa;
    Stream::write32(stream,(void *)((long)pvVar2 + (long)local_24 * 0x28 + 0x1c),0xc);
    Stream::writeF32(stream,*(float32 *)((long)pvVar2 + (long)local_24 * 0x28 + 8));
    Stream::writeI32(stream,(int)((*(long *)((long)pvVar2 + (long)local_24 * 0x28) - (long)pvVar2) /
                                 0x28) * 0x24);
    uVar4 = extraout_XMM0_Da_01;
    uVar5 = extraout_XMM0_Db_01;
  }
  return true;
}

Assistant:

bool
Animation::streamWriteLegacy(Stream *stream)
{
	stream->writeI32(this->numFrames);
	stream->writeI32(this->flags);
	stream->writeF32(this->duration);
	assert(interpInfo->id == 1);
	HAnimKeyFrame *frames = (HAnimKeyFrame*)this->keyframes;
	for(int32 i = 0; i < this->numFrames; i++){
		frames[i].q = conj(frames[i].q);
		stream->write32(&frames[i].q, 4*4);
		frames[i].q = conj(frames[i].q);
		stream->write32(&frames[i].t, 3*4);
		stream->writeF32(frames[i].time);
		stream->writeI32((frames[i].prev - frames)*0x24);
	}
	return true;
}